

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTypeSpecFldInfo.cpp
# Opt level: O2

ObjTypeSpecFldInfo * __thiscall
ObjTypeSpecFldInfoArray::GetInfo
          (ObjTypeSpecFldInfoArray *this,FunctionBody *functionBody,uint index)

{
  WriteBarrierPtr<ObjTypeSpecFldInfo> *pWVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  WriteBarrierPtr<ObjTypeSpecFldInfo> local_30;
  
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x4c4,"(functionBody)","functionBody");
    if (!bVar3) goto LAB_005a3b4e;
    *puVar5 = 0;
  }
  if ((this->infoArray).ptr != (WriteBarrierPtr<ObjTypeSpecFldInfo> *)0x0) {
    uVar4 = Js::FunctionBody::GetInlineCacheCount(functionBody);
    if (uVar4 != this->infoCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                         ,0x4c5,
                         "(this->infoArray == nullptr || functionBody->GetInlineCacheCount() == this->infoCount)"
                         ,
                         "this->infoArray == nullptr || functionBody->GetInlineCacheCount() == this->infoCount"
                        );
      if (!bVar3) goto LAB_005a3b4e;
      *puVar5 = 0;
    }
  }
  uVar4 = Js::FunctionBody::GetInlineCacheCount(functionBody);
  if (uVar4 <= index) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x4c6,"(index < functionBody->GetInlineCacheCount())",
                       "index < functionBody->GetInlineCacheCount()");
    if (!bVar3) {
LAB_005a3b4e:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pWVar1 = (this->infoArray).ptr;
  if (pWVar1 == (WriteBarrierPtr<ObjTypeSpecFldInfo> *)0x0) {
    local_30.ptr = (ObjTypeSpecFldInfo *)0x0;
  }
  else {
    Memory::WriteBarrierPtr<ObjTypeSpecFldInfo>::WriteBarrierPtr(&local_30,pWVar1 + index);
  }
  return local_30.ptr;
}

Assistant:

ObjTypeSpecFldInfo* ObjTypeSpecFldInfoArray::GetInfo(Js::FunctionBody *const functionBody, const uint index) const
{
    Assert(functionBody);
    Assert(this->infoArray == nullptr || functionBody->GetInlineCacheCount() == this->infoCount);
    Assert(index < functionBody->GetInlineCacheCount());
    return this->infoArray ? this->infoArray[index] : nullptr;
}